

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
r_comp::Preprocessor::getMembers
          (Preprocessor *this,Ptr *s,
          vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *members,
          list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          *tpl_args,bool instantiate)

{
  bool bVar1;
  element_type *peVar2;
  reference psVar3;
  shared_ptr<r_comp::RepliStruct> local_68;
  undefined1 local_58 [8];
  Ptr childstruct;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  bool instantiate_local;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *tpl_args_local;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *members_local;
  Ptr *s_local;
  Preprocessor *this_local;
  
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)s);
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin(&peVar2->args);
  childstruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(&peVar2->args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                *)&childstruct.
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_58,psVar3);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              (&local_68,(shared_ptr<r_comp::RepliStruct> *)local_58);
    getMember(this,members,&local_68,tpl_args,instantiate);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_68);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Preprocessor::getMembers(RepliStruct::Ptr s, std::vector<StructureMember> &members, std::list<RepliStruct::Ptr> &tpl_args, bool instantiate)
{
    for (RepliStruct::Ptr childstruct : s->args) {
        getMember(members, childstruct, tpl_args, instantiate);
    }
}